

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  ulong *puVar13;
  byte bVar14;
  undefined1 *puVar15;
  ulong uVar16;
  int iVar17;
  byte *srcBuffer;
  int iVar18;
  undefined1 *puVar19;
  int iVar20;
  ulong uVar21;
  undefined1 *puVar22;
  int iVar23;
  undefined4 in_register_0000008c;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong *puVar29;
  ulong *puVar30;
  bool bVar31;
  BYTE *pStart;
  uint local_12c;
  uint local_128;
  uint local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong *local_108;
  undefined1 *local_100;
  ulong *local_f8;
  BIT_DStream_t local_e8;
  ulong *local_c0;
  ulong *local_b8;
  undefined1 *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  size_t local_80;
  size_t *local_68;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar12 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar12 != 0)) {
      return sVar12;
    }
    sVar12 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar12;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar21 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar11 = uVar21 + uVar5 + (ulong)uVar6 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar11) {
    return 0xffffffffffffffec;
  }
  local_90 = (undefined1 *)((long)dst + dstSize);
  uVar16 = dstSize + 3 >> 2;
  local_88 = (undefined1 *)(uVar16 + (long)dst);
  local_98 = local_88 + uVar16;
  local_b0 = local_98 + uVar16;
  if (local_90 < local_b0) {
    return 0xffffffffffffffec;
  }
  if (uVar4 == 0) {
    return 0xffffffffffffffb8;
  }
  local_c0 = (ulong *)((long)cSrc + 6);
  local_a8 = (ulong *)((long)cSrc + uVar21 + 6);
  uVar7 = *(undefined2 *)((long)DTable + 2);
  if (uVar4 < 8) {
    local_110 = (ulong)*(byte *)local_c0;
    switch(uVar4) {
    case 2:
      goto LAB_00179e27;
    case 3:
      goto LAB_00179e1c;
    case 4:
      break;
    case 7:
      local_110 = local_110 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      local_110 = local_110 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      local_110 = local_110 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      break;
    default:
      goto switchD_00179dd9_default;
    }
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_00179e1c:
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_00179e27:
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_00179dd9_default:
    bVar14 = *(byte *)((long)cSrc + uVar21 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_124 = (uVar25 ^ 0x1f) + (uint)uVar4 * -8 + 0x29;
    local_108 = local_c0;
  }
  else {
    bVar14 = *(byte *)((long)cSrc + uVar21 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    local_110 = *(ulong *)((long)cSrc + (uVar21 - 2));
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_124 = ~uVar25 + 9;
    local_108 = (ulong *)((long)cSrc + (uVar21 - 2));
  }
  if (uVar5 == 0) {
    return 0xffffffffffffffb8;
  }
  local_b8 = (ulong *)((ulong)uVar5 + (long)local_a8);
  if (uVar5 < 8) {
    local_120 = (ulong)(byte)*local_a8;
    switch(uVar5) {
    case 2:
      goto LAB_00179f85;
    case 3:
      goto LAB_00179f7a;
    case 4:
      goto LAB_00179f6a;
    case 5:
      goto LAB_00179f5e;
    case 6:
      break;
    case 7:
      local_120 = local_120 | (ulong)*(byte *)((long)cSrc + uVar21 + 0xc) << 0x30;
      break;
    default:
      goto switchD_00179f03_default;
    }
    local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + uVar21 + 0xb) << 0x28);
LAB_00179f5e:
    local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + uVar21 + 10) << 0x20);
LAB_00179f6a:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 9) * 0x1000000;
LAB_00179f7a:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 8) * 0x10000;
LAB_00179f85:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 7) * 0x100;
switchD_00179f03_default:
    bVar14 = *(byte *)((long)local_b8 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_128 = (uVar25 ^ 0x1f) + (uint)uVar5 * -8 + 0x29;
    local_a0 = local_a8;
  }
  else {
    bVar14 = *(byte *)((long)local_b8 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    local_a0 = local_b8 + -1;
    local_120 = local_b8[-1];
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_128 = ~uVar25 + 9;
  }
  if (uVar6 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar6 + (long)local_b8);
  if (uVar6 < 8) {
    local_118 = (ulong)(byte)*local_b8;
    switch(uVar6) {
    case 2:
      goto LAB_0017a0b1;
    case 3:
      goto LAB_0017a0a7;
    case 4:
      goto LAB_0017a09d;
    case 5:
      goto LAB_0017a092;
    case 6:
      break;
    case 7:
      local_118 = local_118 | (ulong)*(byte *)((long)local_b8 + 6) << 0x30;
      break;
    default:
      goto switchD_0017a052_default;
    }
    local_118 = local_118 + ((ulong)*(byte *)((long)local_b8 + 5) << 0x28);
LAB_0017a092:
    local_118 = local_118 + ((ulong)*(byte *)((long)local_b8 + 4) << 0x20);
LAB_0017a09d:
    local_118 = local_118 + (ulong)*(byte *)((long)local_b8 + 3) * 0x1000000;
LAB_0017a0a7:
    local_118 = local_118 + (ulong)*(byte *)((long)local_b8 + 2) * 0x10000;
LAB_0017a0b1:
    local_118 = local_118 + (ulong)*(byte *)((long)local_b8 + 1) * 0x100;
switchD_0017a052_default:
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_12c = (uVar25 ^ 0x1f) + (uint)uVar6 * -8 + 0x29;
    local_f8 = local_b8;
  }
  else {
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    local_118 = *(ulong *)(srcBuffer + -8);
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    local_12c = ~uVar25 + 9;
    local_f8 = (ulong *)(srcBuffer + -8);
  }
  sVar12 = BIT_initDStream(&local_e8,srcBuffer,cSrcSize - uVar11);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  puVar15 = (undefined1 *)((dstSize - 3) + (long)dst);
  puVar30 = (ulong *)((long)cSrc + 0xe);
  puVar29 = local_a8 + 1;
  puVar13 = local_b8 + 1;
  cVar9 = (char)uVar7;
  if (local_b0 < puVar15 && 7 < (ulong)((long)local_90 - (long)local_b0)) {
    local_80 = local_e8.bitContainer;
    bVar14 = -cVar9 & 0x3f;
    local_68 = (size_t *)local_e8.ptr;
    lVar8 = uVar16 * 3;
    do {
      puVar19 = (undefined1 *)dst;
      uVar11 = (local_110 << ((byte)local_124 & 0x3f)) >> bVar14;
      uVar21 = (local_120 << ((byte)local_128 & 0x3f)) >> bVar14;
      uVar24 = (local_118 << ((byte)local_12c & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar11 * 2 + 4) + local_124;
      uVar26 = (local_80 << ((byte)local_e8.bitsConsumed & 0x3f)) >> bVar14;
      uVar27 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *puVar19 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar18 = *(byte *)((long)DTable + uVar21 * 2 + 4) + local_128;
      puVar19[uVar16] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      iVar20 = *(byte *)((long)DTable + uVar24 * 2 + 4) + local_12c;
      puVar19[uVar16 * 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar26 * 2 + 4) + local_e8.bitsConsumed;
      puVar19[lVar8] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar11 = (local_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      uVar24 = (local_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar17;
      uVar26 = (local_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      uVar21 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar18 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar18;
      puVar19[uVar16 + 1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar20;
      puVar19[uVar16 * 2 + 1] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar19[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uVar21 = (local_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      uVar24 = (local_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      iVar18 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar18;
      uVar26 = (local_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      uVar11 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[uVar16 + 2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar20;
      puVar19[uVar16 * 2 + 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar19[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      local_124 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      bVar1 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar19[uVar16 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      bVar2 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar19[uVar16 * 2 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      bVar3 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar19[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar17 = 3;
      if (local_108 < puVar30) {
        iVar10 = 3;
      }
      else {
        local_108 = (ulong *)((long)local_108 - (ulong)(local_124 >> 3));
        local_124 = local_124 & 7;
        local_110 = *local_108;
        iVar10 = 0;
      }
      local_128 = iVar18 + (uint)bVar1;
      if (puVar29 <= local_a0) {
        local_a0 = (ulong *)((long)local_a0 - (ulong)(local_128 >> 3));
        local_128 = local_128 & 7;
        local_120 = *local_a0;
        iVar17 = 0;
      }
      local_12c = iVar20 + (uint)bVar2;
      iVar20 = 3;
      if (local_f8 < puVar13) {
        iVar18 = 3;
      }
      else {
        local_f8 = (ulong *)((long)local_f8 - (ulong)(local_12c >> 3));
        local_12c = local_12c & 7;
        local_118 = *local_f8;
        iVar18 = 0;
      }
      local_e8.bitsConsumed = iVar23 + (uint)bVar3;
      if (local_e8.limitPtr <= local_68) {
        local_68 = (size_t *)((long)local_68 - (ulong)(local_e8.bitsConsumed >> 3));
        local_e8.bitsConsumed = local_e8.bitsConsumed & 7;
        local_e8.bitContainer = *local_68;
        iVar20 = 0;
        local_80 = local_e8.bitContainer;
      }
    } while ((puVar19 + lVar8 + 4 < puVar15) &&
            (dst = puVar19 + 4, ((iVar17 == 0 && iVar10 == 0) && iVar18 == 0) && iVar20 == 0));
    dst = puVar19 + 4;
    local_e8.ptr = (char *)local_68;
    local_100 = (undefined1 *)((long)dst + lVar8);
    puVar19 = (undefined1 *)((long)dst + uVar16 * 2);
    puVar22 = (undefined1 *)((long)dst + uVar16);
  }
  else {
    local_100 = local_b0;
    puVar19 = local_98;
    puVar22 = local_88;
  }
  if ((local_88 < dst) || (local_98 < puVar22)) {
    return 0xffffffffffffffec;
  }
  if (local_b0 < puVar19) {
    return 0xffffffffffffffec;
  }
  uVar11 = (ulong)local_124;
  if ((long)local_88 - (long)dst < 4) {
    if (local_124 < 0x41) {
      if (local_108 < puVar30) {
        if (local_108 == local_c0) {
          local_108 = local_c0;
          goto LAB_0017a7c5;
        }
        uVar25 = (int)local_108 - (int)local_c0;
        if (local_c0 <= (ulong *)((long)local_108 - (ulong)(local_124 >> 3))) {
          uVar25 = local_124 >> 3;
        }
        local_124 = local_124 + uVar25 * -8;
      }
      else {
        uVar25 = local_124 >> 3;
        local_124 = local_124 & 7;
      }
      uVar11 = (ulong)local_124;
      local_108 = (ulong *)((long)local_108 - (ulong)uVar25);
      local_110 = *local_108;
    }
  }
  else if (local_124 < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (local_108 < puVar30) {
        if (local_108 == local_c0) {
          local_108 = local_c0;
          break;
        }
        bVar31 = local_c0 <= (ulong *)((long)local_108 - (uVar11 >> 3));
        uVar25 = (int)local_108 - (int)local_c0;
        if (bVar31) {
          uVar25 = (uint)(uVar11 >> 3);
        }
        uVar28 = (uint)uVar11 + uVar25 * -8;
      }
      else {
        uVar25 = (uint)(uVar11 >> 3);
        uVar28 = (uint)uVar11 & 7;
        bVar31 = true;
      }
      uVar11 = (ulong)uVar28;
      local_108 = (ulong *)((long)local_108 - (ulong)uVar25);
      local_110 = *local_108;
      if ((local_88 + -3 <= dst) || (!bVar31)) break;
      uVar11 = (local_110 << ((byte)uVar28 & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uVar28;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      uVar21 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar16 = (local_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uVar25 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar17;
      uVar11 = (ulong)uVar25;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      dst = (void *)((long)dst + 4);
      if (0x40 < uVar25) break;
    } while( true );
  }
LAB_0017a7c5:
  uVar25 = (uint)uVar11;
  if (dst < local_88) {
    do {
      uVar21 = (local_110 << ((byte)uVar11 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar25 = (int)uVar11 + (uint)*(byte *)((long)DTable + uVar21 * 2 + 4);
      uVar11 = (ulong)uVar25;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < local_88);
  }
  puVar30 = local_a0;
  if ((long)local_98 - (long)puVar22 < 4) {
    if (local_128 < 0x41) {
      if (local_a0 < puVar29) {
        puVar30 = local_a8;
        if (local_a0 == local_a8) goto LAB_0017a9e3;
        uVar28 = (int)local_a0 - (int)local_a8;
        if (local_a8 <= (ulong *)((long)local_a0 - (ulong)(local_128 >> 3))) {
          uVar28 = local_128 >> 3;
        }
        local_128 = local_128 + uVar28 * -8;
      }
      else {
        uVar28 = local_128 >> 3;
        local_128 = local_128 & 7;
      }
      puVar30 = (ulong *)((long)local_a0 - (ulong)uVar28);
      local_120 = *puVar30;
    }
  }
  else if (local_128 < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (local_a0 < puVar29) {
        puVar30 = local_a8;
        if (local_a0 == local_a8) break;
        bVar31 = local_a8 <= (ulong *)((long)local_a0 - (ulong)(local_128 >> 3));
        uVar28 = (int)local_a0 - (int)local_a8;
        if (bVar31) {
          uVar28 = local_128 >> 3;
        }
        local_128 = local_128 + uVar28 * -8;
      }
      else {
        uVar28 = local_128 >> 3;
        local_128 = local_128 & 7;
        bVar31 = true;
      }
      puVar30 = (ulong *)((long)local_a0 - (ulong)uVar28);
      local_120 = *puVar30;
      if ((local_98 + -3 <= puVar22) || (!bVar31)) break;
      uVar11 = (local_120 << ((byte)local_128 & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar11 * 2 + 4) + local_128;
      *puVar22 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      uVar21 = (local_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar11 = (local_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      local_128 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      puVar22[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar22 = puVar22 + 4;
      local_a0 = puVar30;
      if (0x40 < local_128) break;
    } while( true );
  }
LAB_0017a9e3:
  if (puVar22 < local_98) {
    do {
      uVar11 = (local_120 << ((byte)local_128 & 0x3f)) >> (-cVar9 & 0x3fU);
      local_128 = local_128 + *(byte *)((long)DTable + uVar11 * 2 + 4);
      *puVar22 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar22 = puVar22 + 1;
    } while (puVar22 < local_98);
  }
  puVar29 = local_f8;
  if ((long)local_b0 - (long)puVar19 < 4) {
    if (local_12c < 0x41) {
      if (local_f8 < puVar13) {
        puVar29 = local_b8;
        if (local_f8 == local_b8) goto LAB_0017abdf;
        uVar28 = (int)local_f8 - (int)local_b8;
        if (local_b8 <= (ulong *)((long)local_f8 - (ulong)(local_12c >> 3))) {
          uVar28 = local_12c >> 3;
        }
        local_12c = local_12c + uVar28 * -8;
      }
      else {
        uVar28 = local_12c >> 3;
        local_12c = local_12c & 7;
      }
      puVar29 = (ulong *)((long)local_f8 - (ulong)uVar28);
      local_118 = *puVar29;
    }
  }
  else if (local_12c < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (local_f8 < puVar13) {
        puVar29 = local_b8;
        if (local_f8 == local_b8) break;
        bVar31 = local_b8 <= (ulong *)((long)local_f8 - (ulong)(local_12c >> 3));
        uVar28 = (int)local_f8 - (int)local_b8;
        if (bVar31) {
          uVar28 = local_12c >> 3;
        }
        local_12c = local_12c + uVar28 * -8;
      }
      else {
        uVar28 = local_12c >> 3;
        local_12c = local_12c & 7;
        bVar31 = true;
      }
      puVar29 = (ulong *)((long)local_f8 - (ulong)uVar28);
      local_118 = *puVar29;
      if ((local_b0 + -3 <= puVar19) || (!bVar31)) break;
      uVar11 = (local_118 << ((byte)local_12c & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar11 * 2 + 4) + local_12c;
      *puVar19 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      uVar21 = (local_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar11 = (local_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      local_12c = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar19 = puVar19 + 4;
      local_f8 = puVar29;
      if (0x40 < local_12c) break;
    } while( true );
  }
LAB_0017abdf:
  if (puVar19 < local_b0) {
    do {
      uVar11 = (local_118 << ((byte)local_12c & 0x3f)) >> (-cVar9 & 0x3fU);
      local_12c = local_12c + *(byte *)((long)DTable + uVar11 * 2 + 4);
      *puVar19 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar19 = puVar19 + 1;
    } while (puVar19 < local_b0);
  }
  if ((long)local_90 - (long)local_100 < 4) {
    if (local_e8.bitsConsumed < 0x41) {
      if (local_e8.ptr < local_e8.limitPtr) {
        if (local_e8.ptr == local_e8.start) goto LAB_0017ae38;
        uVar28 = (int)local_e8.ptr - (int)local_e8.start;
        if (local_e8.start <= (size_t *)((long)local_e8.ptr - (ulong)(local_e8.bitsConsumed >> 3)))
        {
          uVar28 = local_e8.bitsConsumed >> 3;
        }
        local_e8.bitsConsumed = local_e8.bitsConsumed + uVar28 * -8;
      }
      else {
        uVar28 = local_e8.bitsConsumed >> 3;
        local_e8.bitsConsumed = local_e8.bitsConsumed & 7;
      }
      local_e8.ptr = (char *)((long)local_e8.ptr - (ulong)uVar28);
      local_e8.bitContainer = *(size_t *)local_e8.ptr;
    }
  }
  else if (local_e8.bitsConsumed < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (local_e8.ptr < local_e8.limitPtr) {
        if (local_e8.ptr == local_e8.start) break;
        bVar31 = local_e8.start <=
                 (size_t *)((long)local_e8.ptr - (ulong)(local_e8.bitsConsumed >> 3));
        uVar11 = (ulong)(uint)((int)local_e8.ptr - (int)local_e8.start);
        if (bVar31) {
          uVar11 = (ulong)(local_e8.bitsConsumed >> 3);
        }
        local_e8.bitsConsumed = local_e8.bitsConsumed + (int)uVar11 * -8;
      }
      else {
        uVar11 = (ulong)(local_e8.bitsConsumed >> 3);
        local_e8.bitsConsumed = local_e8.bitsConsumed & 7;
        bVar31 = true;
      }
      local_e8.ptr = (char *)((long)local_e8.ptr - uVar11);
      local_e8.bitContainer = *(size_t *)local_e8.ptr;
      if ((puVar15 <= local_100) || (!bVar31)) break;
      uVar11 = (local_e8.bitContainer << ((byte)local_e8.bitsConsumed & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar11 * 2 + 4) + local_e8.bitsConsumed;
      *local_100 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      local_100[1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      local_100[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (local_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      local_e8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar17;
      local_100[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      local_100 = local_100 + 4;
      if (0x40 < local_e8.bitsConsumed) break;
    } while( true );
  }
LAB_0017ae38:
  if (local_100 < local_90) {
    do {
      uVar11 = (local_e8.bitContainer << ((byte)local_e8.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU);
      local_e8.bitsConsumed = *(byte *)((long)DTable + uVar11 * 2 + 4) + local_e8.bitsConsumed;
      *local_100 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      local_100 = local_100 + 1;
    } while (local_100 < local_90);
  }
  if (local_e8.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_e8.ptr != local_e8.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_12c != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar29 != local_b8) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_128 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar30 != local_a8) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar25 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_108 != local_c0) {
    return 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}